

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::visitTupleExtract(OptimizeInstructions *this,TupleExtract *curr)

{
  Module *pMVar1;
  undefined1 auVar2 [16];
  Type *pTVar3;
  LocalSet *this_00;
  Expression *last;
  Expression *pEVar4;
  Type in_R8;
  MixedArena *this_01;
  Iterator local_58;
  Expression *local_48;
  Type local_40;
  Index local_34;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id != 1) &&
     (pEVar4 = curr->tuple, pEVar4->_id == TupleMakeId)) {
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
    local_58.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         &pEVar4->type;
    local_58.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)curr->index;
    pTVar3 = wasm::Type::Iterator::operator*(&local_58);
    local_40.id = pTVar3->id;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_40.id;
    local_34 = Builder::addVar((Builder *)
                               (this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar2 << 0x40),in_R8);
    if ((ulong)curr->index < pEVar4[1].type.id) {
      local_48 = *(Expression **)(*(long *)(pEVar4 + 1) + (ulong)curr->index * 8);
      this_01 = &pMVar1->allocator;
      this_00 = (LocalSet *)MixedArena::allocSpace(this_01,0x20,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId
      ;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      this_00->index = local_34;
      this_00->value = local_48;
      LocalSet::makeTee(this_00,local_40);
      if ((ulong)curr->index < pEVar4[1].type.id) {
        *(LocalSet **)(*(long *)(pEVar4 + 1) + (ulong)curr->index * 8) = this_00;
        last = (Expression *)MixedArena::allocSpace(this_01,0x18,8);
        last->_id = LocalGetId;
        *(Index *)(last + 1) = local_34;
        (last->type).id = local_40.id;
        pEVar4 = wasm::getDroppedChildrenAndAppend
                           (pEVar4,(this->
                                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                   ).
                                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .
                                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .currModule,
                            &((this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).super_Pass.runner)->options,last,NoticeParentEffects);
        replaceCurrent(this,pEVar4);
        return;
      }
    }
    __assert_fail("index < usedElements",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                  ,0xbc,
                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                 );
  }
  return;
}

Assistant:

void visitTupleExtract(TupleExtract* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    if (auto* make = curr->tuple->dynCast<TupleMake>()) {
      Builder builder(*getModule());

      // Store the value of the lane we want in a tee, and return that after a
      // drop of the tuple (which might have side effects).
      auto valueType = make->type[curr->index];
      Index tempLocal = builder.addVar(getFunction(), valueType);
      make->operands[curr->index] =
        builder.makeLocalTee(tempLocal, make->operands[curr->index], valueType);
      auto* get = builder.makeLocalGet(tempLocal, valueType);
      replaceCurrent(getDroppedChildrenAndAppend(make, get));
    }
  }